

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPSIO.cpp
# Opt level: O2

HighsStatus
writeModelAsMps(HighsOptions *options,string *filename,HighsModel *model,bool free_format)

{
  HighsInt *num_row;
  pointer pbVar1;
  pointer pbVar2;
  pointer pbVar3;
  pointer pbVar4;
  int iVar5;
  bool bVar6;
  string objective_name;
  HighsStatus HVar7;
  HighsStatus HVar8;
  HighsStatus HVar9;
  HighsStatus HVar10;
  HighsLogOptions *log_options;
  int iVar11;
  bool bVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe68;
  int iVar13;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_row_names;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_col_names;
  string local_objective_name;
  string local_d0 [32];
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pbVar1 = (model->lp_).col_names_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (model->lp_).col_names_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar3 = (model->lp_).row_names_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar4 = (model->lp_).row_names_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_col_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_col_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_col_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_row_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_row_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_row_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(&local_col_names,(long)(model->lp_).num_col_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(&local_row_names,(long)(model->lp_).num_row_);
  if (pbVar2 != pbVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&local_col_names,&(model->lp_).col_names_);
  }
  if (pbVar3 != pbVar4) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&local_row_names,&(model->lp_).row_names_);
  }
  iVar11 = 8;
  if (free_format) {
    iVar11 = 0x7fffffff;
  }
  iVar13 = iVar11;
  std::__cxx11::string::string((string *)&local_50,"column",(allocator *)&local_objective_name);
  log_options = &(options->super_HighsOptionsStruct).log_options;
  HVar7 = normaliseNames(log_options,&local_50,(model->lp_).num_col_,&local_col_names,
                         (HighsInt *)&stack0xfffffffffffffe74);
  std::__cxx11::string::~string((string *)&local_50);
  if (HVar7 != kError) {
    std::__cxx11::string::string((string *)&local_70,"row",(allocator *)&local_objective_name);
    num_row = &(model->lp_).num_row_;
    HVar8 = normaliseNames(log_options,&local_70,*num_row,&local_row_names,
                           (HighsInt *)&stack0xfffffffffffffe70);
    std::__cxx11::string::~string((string *)&local_70);
    if (HVar8 != kError) {
      iVar5 = iVar11;
      if (iVar11 < iVar13) {
        iVar5 = iVar13;
      }
      bVar6 = !free_format;
      bVar12 = 8 < iVar5 && bVar6;
      if (bVar12) {
        highsLogUser(log_options,kWarning,
                     "Maximum name length is %d so using free format rather than fixed format\n");
        free_format = true;
      }
      findModelObjectiveName_abi_cxx11_(&local_objective_name,&model->lp_,&model->hessian_);
      std::__cxx11::string::string((string *)&local_90,(string *)filename);
      std::__cxx11::string::string((string *)&local_b0,(string *)&(model->lp_).model_name_);
      std::__cxx11::string::string(local_d0,(string *)&local_objective_name);
      objective_name._M_string_length = (size_type)&local_col_names;
      objective_name._M_dataplus._M_p = (pointer)local_d0;
      objective_name.field_2._M_allocated_capacity = (size_type)&local_row_names;
      objective_name.field_2._M_local_buf[8] = free_format;
      objective_name.field_2._9_7_ = 0;
      HVar9 = writeMps(log_options,&local_90,&local_b0,num_row,(HighsInt *)model,
                       &(model->hessian_).dim_,&(model->lp_).sense_,&(model->lp_).offset_,
                       &(model->lp_).col_cost_,&(model->lp_).col_lower_,&(model->lp_).col_upper_,
                       &(model->lp_).row_lower_,&(model->lp_).row_upper_,
                       &(model->lp_).a_matrix_.start_,&(model->lp_).a_matrix_.index_,
                       &(model->lp_).a_matrix_.value_,&(model->hessian_).start_,
                       &(model->hessian_).index_,&(model->hessian_).value_,
                       &(model->lp_).integrality_,objective_name,in_stack_fffffffffffffe68,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)CONCAT44(iVar13,iVar11),bVar12 || (HVar7 == kWarning || HVar8 == kWarning)
                      );
      std::__cxx11::string::~string(local_d0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
      HVar10 = kWarning;
      if (HVar9 != kOk) {
        HVar10 = HVar9;
      }
      if ((8 >= iVar5 || !bVar6) && (HVar7 != kWarning && HVar8 != kWarning)) {
        HVar10 = HVar9;
      }
      std::__cxx11::string::~string((string *)&local_objective_name);
      goto LAB_0022b563;
    }
  }
  HVar10 = kError;
LAB_0022b563:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_row_names);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_col_names);
  return HVar10;
}

Assistant:

HighsStatus writeModelAsMps(const HighsOptions& options,
                            const std::string filename, const HighsModel& model,
                            const bool free_format) {
  bool warning_found = false;
  const HighsLp& lp = model.lp_;
  const HighsHessian& hessian = model.hessian_;
  bool have_col_names = (lp.col_names_.size() != 0);
  bool have_row_names = (lp.row_names_.size() != 0);
  std::vector<std::string> local_col_names;
  std::vector<std::string> local_row_names;
  local_col_names.resize(lp.num_col_);
  local_row_names.resize(lp.num_row_);
  // Initialise the local names to any existing names
  if (have_col_names) local_col_names = lp.col_names_;
  if (have_row_names) local_row_names = lp.row_names_;
  //
  // Normalise the column names
  HighsInt max_col_name_length = kHighsIInf;
  if (!free_format) max_col_name_length = 8;
  HighsStatus col_name_status =
      normaliseNames(options.log_options, "column", lp.num_col_,
                     local_col_names, max_col_name_length);
  if (col_name_status == HighsStatus::kError) return col_name_status;
  warning_found = col_name_status == HighsStatus::kWarning || warning_found;
  //
  // Normalise the row names
  HighsInt max_row_name_length = kHighsIInf;
  if (!free_format) max_row_name_length = 8;
  HighsStatus row_name_status =
      normaliseNames(options.log_options, "row", lp.num_row_, local_row_names,
                     max_row_name_length);
  if (row_name_status == HighsStatus::kError) return row_name_status;
  warning_found = row_name_status == HighsStatus::kWarning || warning_found;

  HighsInt max_name_length = std::max(max_col_name_length, max_row_name_length);
  bool use_free_format = free_format;
  if (!free_format) {
    if (max_name_length > 8) {
      highsLogUser(options.log_options, HighsLogType::kWarning,
                   "Maximum name length is %" HIGHSINT_FORMAT
                   " so using free format rather "
                   "than fixed format\n",
                   max_name_length);
      use_free_format = true;
      warning_found = true;
    }
  }
  // Set a local objective name, creating one if necessary
  const std::string local_objective_name =
      findModelObjectiveName(&lp, &hessian);
  // If there is Hessian data to write out, writeMps assumes that hessian is
  // triangular
  if (hessian.dim_) assert(hessian.format_ == HessianFormat::kTriangular);

  HighsStatus write_status = writeMps(
      options.log_options, filename, lp.model_name_, lp.num_row_, lp.num_col_,
      hessian.dim_, lp.sense_, lp.offset_, lp.col_cost_, lp.col_lower_,
      lp.col_upper_, lp.row_lower_, lp.row_upper_, lp.a_matrix_.start_,
      lp.a_matrix_.index_, lp.a_matrix_.value_, hessian.start_, hessian.index_,
      hessian.value_, lp.integrality_, local_objective_name, local_col_names,
      local_row_names, use_free_format);
  if (write_status == HighsStatus::kOk && warning_found)
    return HighsStatus::kWarning;
  return write_status;
}